

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void idct16_sse2(__m128i *input,__m128i *output)

{
  __m128i alVar1;
  __m128i alVar2;
  __m128i alVar3;
  longlong lVar4;
  longlong lVar5;
  longlong lVar6;
  int32_t *cospi;
  int8_t cos_bit;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  __m128i _in0;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar20 [16];
  __m128i _in1_1;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  __m128i _in0_3;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  __m128i _in0_2;
  undefined1 auVar50 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  __m128i _in1_3;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  __m128i _in1;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  __m128i _in0_1;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  __m128i _in1_2;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  __m128i alVar117;
  __m128i alVar118;
  undefined2 local_168;
  undefined2 uStack_166;
  undefined2 uStack_164;
  undefined2 uStack_162;
  undefined2 uStack_160;
  undefined2 uStack_15e;
  undefined2 uStack_15c;
  undefined2 uStack_15a;
  undefined2 local_158;
  undefined2 uStack_156;
  undefined2 uStack_154;
  undefined2 uStack_152;
  undefined2 uStack_150;
  undefined2 uStack_14e;
  undefined2 uStack_14c;
  undefined2 uStack_14a;
  __m128i local_138;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  longlong lVar7;
  longlong extraout_RDX;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar23 [16];
  undefined1 auVar30 [16];
  undefined1 auVar24 [16];
  undefined1 auVar31 [16];
  undefined1 auVar25 [16];
  undefined1 auVar32 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  
  alVar117 = input[10];
  alVar118 = input[9];
  alVar1 = input[5];
  alVar2 = input[0xd];
  alVar3 = input[1];
  auVar53._0_12_ = alVar3._0_12_;
  auVar53._12_2_ = alVar3[0]._6_2_;
  auVar53._14_2_ = *(undefined2 *)((long)input[0xf] + 6);
  auVar52._12_4_ = auVar53._12_4_;
  auVar52._0_10_ = alVar3._0_10_;
  auVar52._10_2_ = *(undefined2 *)((long)input[0xf] + 4);
  auVar51._10_6_ = auVar52._10_6_;
  auVar51._0_8_ = alVar3[0];
  auVar51._8_2_ = alVar3[0]._4_2_;
  auVar50._8_8_ = auVar51._8_8_;
  auVar50._6_2_ = *(undefined2 *)((long)input[0xf] + 2);
  auVar50._4_2_ = alVar3[0]._2_2_;
  auVar50._0_2_ = (undefined2)alVar3[0];
  auVar50._2_2_ = (short)input[0xf][0];
  auVar82._2_2_ = (short)input[0xf][1];
  auVar82._0_2_ = (short)alVar3[1];
  auVar82._4_2_ = alVar3[1]._2_2_;
  auVar82._6_2_ = *(undefined2 *)((long)input[0xf] + 10);
  auVar82._8_2_ = alVar3[1]._4_2_;
  auVar82._10_2_ = *(undefined2 *)((long)input[0xf] + 0xc);
  auVar82._12_2_ = alVar3[1]._6_2_;
  auVar82._14_2_ = *(undefined2 *)((long)input[0xf] + 0xe);
  auVar8._8_4_ = 0xf0140191;
  auVar8._0_8_ = 0xf0140191f0140191;
  auVar8._12_4_ = 0xf0140191;
  auVar12 = pmaddwd(auVar50,auVar8);
  auVar8 = pmaddwd(auVar8,auVar82);
  auVar68._8_4_ = 0x1910fec;
  auVar68._0_8_ = 0x1910fec01910fec;
  auVar68._12_4_ = 0x1910fec;
  auVar54 = pmaddwd(auVar50,auVar68);
  auVar83 = pmaddwd(auVar82,auVar68);
  auVar13._0_4_ = auVar12._0_4_ + 0x800 >> 0xc;
  auVar13._4_4_ = auVar12._4_4_ + 0x800 >> 0xc;
  auVar13._8_4_ = auVar12._8_4_ + 0x800 >> 0xc;
  auVar13._12_4_ = auVar12._12_4_ + 0x800 >> 0xc;
  auVar12._0_4_ = auVar8._0_4_ + 0x800 >> 0xc;
  auVar12._4_4_ = auVar8._4_4_ + 0x800 >> 0xc;
  auVar12._8_4_ = auVar8._8_4_ + 0x800 >> 0xc;
  auVar12._12_4_ = auVar8._12_4_ + 0x800 >> 0xc;
  auVar12 = packssdw(auVar13,auVar12);
  auVar55._0_4_ = auVar54._0_4_ + 0x800 >> 0xc;
  auVar55._4_4_ = auVar54._4_4_ + 0x800 >> 0xc;
  auVar55._8_4_ = auVar54._8_4_ + 0x800 >> 0xc;
  auVar55._12_4_ = auVar54._12_4_ + 0x800 >> 0xc;
  auVar84._0_4_ = auVar83._0_4_ + 0x800 >> 0xc;
  auVar84._4_4_ = auVar83._4_4_ + 0x800 >> 0xc;
  auVar84._8_4_ = auVar83._8_4_ + 0x800 >> 0xc;
  auVar84._12_4_ = auVar83._12_4_ + 0x800 >> 0xc;
  auVar56 = packssdw(auVar55,auVar84);
  auVar72._0_12_ = alVar118._0_12_;
  auVar72._12_2_ = alVar118[0]._6_2_;
  auVar72._14_2_ = *(undefined2 *)((long)input[7] + 6);
  auVar71._12_4_ = auVar72._12_4_;
  auVar71._0_10_ = alVar118._0_10_;
  auVar71._10_2_ = *(undefined2 *)((long)input[7] + 4);
  auVar70._10_6_ = auVar71._10_6_;
  auVar70._0_8_ = alVar118[0];
  auVar70._8_2_ = alVar118[0]._4_2_;
  auVar69._8_8_ = auVar70._8_8_;
  auVar69._6_2_ = *(undefined2 *)((long)input[7] + 2);
  auVar69._4_2_ = alVar118[0]._2_2_;
  auVar69._0_2_ = (undefined2)alVar118[0];
  auVar69._2_2_ = (short)input[7][0];
  auVar97._2_2_ = (short)input[7][1];
  auVar97._0_2_ = (short)alVar118[1];
  auVar97._4_2_ = alVar118[1]._2_2_;
  auVar97._6_2_ = *(undefined2 *)((long)input[7] + 10);
  auVar97._8_2_ = alVar118[1]._4_2_;
  auVar97._10_2_ = *(undefined2 *)((long)input[7] + 0xc);
  auVar97._12_2_ = alVar118[1]._6_2_;
  auVar97._14_2_ = *(undefined2 *)((long)input[7] + 0xe);
  auVar54._8_4_ = 0xf5da0c5e;
  auVar54._0_8_ = 0xf5da0c5ef5da0c5e;
  auVar54._12_4_ = 0xf5da0c5e;
  auVar83 = pmaddwd(auVar69,auVar54);
  auVar8 = pmaddwd(auVar54,auVar97);
  auVar59._8_4_ = 0xc5e0a26;
  auVar59._0_8_ = 0xc5e0a260c5e0a26;
  auVar59._12_4_ = 0xc5e0a26;
  auVar54 = pmaddwd(auVar69,auVar59);
  auVar98 = pmaddwd(auVar97,auVar59);
  alVar118 = input[2];
  auVar85._0_4_ = auVar83._0_4_ + 0x800 >> 0xc;
  auVar85._4_4_ = auVar83._4_4_ + 0x800 >> 0xc;
  auVar85._8_4_ = auVar83._8_4_ + 0x800 >> 0xc;
  auVar85._12_4_ = auVar83._12_4_ + 0x800 >> 0xc;
  auVar83._0_4_ = auVar8._0_4_ + 0x800 >> 0xc;
  auVar83._4_4_ = auVar8._4_4_ + 0x800 >> 0xc;
  auVar83._8_4_ = auVar8._8_4_ + 0x800 >> 0xc;
  auVar83._12_4_ = auVar8._12_4_ + 0x800 >> 0xc;
  auVar86 = packssdw(auVar85,auVar83);
  auVar73._0_4_ = auVar54._0_4_ + 0x800 >> 0xc;
  auVar73._4_4_ = auVar54._4_4_ + 0x800 >> 0xc;
  auVar73._8_4_ = auVar54._8_4_ + 0x800 >> 0xc;
  auVar73._12_4_ = auVar54._12_4_ + 0x800 >> 0xc;
  auVar99._0_4_ = auVar98._0_4_ + 0x800 >> 0xc;
  auVar99._4_4_ = auVar98._4_4_ + 0x800 >> 0xc;
  auVar99._8_4_ = auVar98._8_4_ + 0x800 >> 0xc;
  auVar99._12_4_ = auVar98._12_4_ + 0x800 >> 0xc;
  auVar74 = packssdw(auVar73,auVar99);
  auVar103._0_12_ = alVar1._0_12_;
  auVar103._12_2_ = alVar1[0]._6_2_;
  auVar103._14_2_ = *(undefined2 *)((long)input[0xb] + 6);
  auVar102._12_4_ = auVar103._12_4_;
  auVar102._0_10_ = alVar1._0_10_;
  auVar102._10_2_ = *(undefined2 *)((long)input[0xb] + 4);
  auVar101._10_6_ = auVar102._10_6_;
  auVar101._0_8_ = alVar1[0];
  auVar101._8_2_ = alVar1[0]._4_2_;
  auVar100._8_8_ = auVar101._8_8_;
  auVar100._6_2_ = *(undefined2 *)((long)input[0xb] + 2);
  auVar100._4_2_ = alVar1[0]._2_2_;
  auVar100._0_2_ = (undefined2)alVar1[0];
  auVar100._2_2_ = (short)input[0xb][0];
  auVar88._2_2_ = (short)input[0xb][1];
  auVar88._0_2_ = (short)alVar1[1];
  auVar88._4_2_ = alVar1[1]._2_2_;
  auVar88._6_2_ = *(undefined2 *)((long)input[0xb] + 10);
  auVar88._8_2_ = alVar1[1]._4_2_;
  auVar88._10_2_ = *(undefined2 *)((long)input[0xb] + 0xc);
  auVar88._12_2_ = alVar1[1]._6_2_;
  auVar88._14_2_ = *(undefined2 *)((long)input[0xb] + 0xe);
  auVar98._8_4_ = 0xf1e4078b;
  auVar98._0_8_ = 0xf1e4078bf1e4078b;
  auVar98._12_4_ = 0xf1e4078b;
  auVar54 = pmaddwd(auVar100,auVar98);
  auVar8 = pmaddwd(auVar98,auVar88);
  auVar113._8_4_ = 0x78b0e1c;
  auVar113._0_8_ = 0x78b0e1c078b0e1c;
  auVar113._12_4_ = 0x78b0e1c;
  auVar98 = pmaddwd(auVar100,auVar113);
  auVar83 = pmaddwd(auVar88,auVar113);
  auVar21._0_4_ = auVar54._0_4_ + 0x800 >> 0xc;
  auVar21._4_4_ = auVar54._4_4_ + 0x800 >> 0xc;
  auVar21._8_4_ = auVar54._8_4_ + 0x800 >> 0xc;
  auVar21._12_4_ = auVar54._12_4_ + 0x800 >> 0xc;
  auVar114._0_4_ = auVar8._0_4_ + 0x800 >> 0xc;
  auVar114._4_4_ = auVar8._4_4_ + 0x800 >> 0xc;
  auVar114._8_4_ = auVar8._8_4_ + 0x800 >> 0xc;
  auVar114._12_4_ = auVar8._12_4_ + 0x800 >> 0xc;
  auVar54 = packssdw(auVar21,auVar114);
  auVar104._0_4_ = auVar98._0_4_ + 0x800 >> 0xc;
  auVar104._4_4_ = auVar98._4_4_ + 0x800 >> 0xc;
  auVar104._8_4_ = auVar98._8_4_ + 0x800 >> 0xc;
  auVar104._12_4_ = auVar98._12_4_ + 0x800 >> 0xc;
  auVar89._0_4_ = auVar83._0_4_ + 0x800 >> 0xc;
  auVar89._4_4_ = auVar83._4_4_ + 0x800 >> 0xc;
  auVar89._8_4_ = auVar83._8_4_ + 0x800 >> 0xc;
  auVar89._12_4_ = auVar83._12_4_ + 0x800 >> 0xc;
  auVar105 = packssdw(auVar104,auVar89);
  auVar93._0_12_ = alVar2._0_12_;
  auVar93._12_2_ = alVar2[0]._6_2_;
  auVar93._14_2_ = *(undefined2 *)((long)input[3] + 6);
  auVar92._12_4_ = auVar93._12_4_;
  auVar92._0_10_ = alVar2._0_10_;
  auVar92._10_2_ = *(undefined2 *)((long)input[3] + 4);
  auVar91._10_6_ = auVar92._10_6_;
  auVar91._0_8_ = alVar2[0];
  auVar91._8_2_ = alVar2[0]._4_2_;
  auVar90._8_8_ = auVar91._8_8_;
  auVar90._6_2_ = *(undefined2 *)((long)input[3] + 2);
  auVar90._4_2_ = alVar2[0]._2_2_;
  auVar90._0_2_ = (undefined2)alVar2[0];
  auVar90._2_2_ = (short)input[3][0];
  auVar107._2_2_ = (short)input[3][1];
  auVar107._0_2_ = (short)alVar2[1];
  auVar107._4_2_ = alVar2[1]._2_2_;
  auVar107._6_2_ = *(undefined2 *)((long)input[3] + 10);
  auVar107._8_2_ = alVar2[1]._4_2_;
  auVar107._10_2_ = *(undefined2 *)((long)input[3] + 0xc);
  auVar107._12_2_ = alVar2[1]._6_2_;
  auVar107._14_2_ = *(undefined2 *)((long)input[3] + 0xe);
  auVar61._8_4_ = 0xfb5b0f50;
  auVar61._0_8_ = 0xfb5b0f50fb5b0f50;
  auVar61._12_4_ = 0xfb5b0f50;
  auVar114 = pmaddwd(auVar90,auVar61);
  auVar8 = pmaddwd(auVar61,auVar107);
  auVar36._8_4_ = 0xf5004a5;
  auVar36._0_8_ = 0xf5004a50f5004a5;
  auVar36._12_4_ = 0xf5004a5;
  auVar83 = pmaddwd(auVar90,auVar36);
  auVar98 = pmaddwd(auVar107,auVar36);
  auVar115._0_4_ = auVar114._0_4_ + 0x800 >> 0xc;
  auVar115._4_4_ = auVar114._4_4_ + 0x800 >> 0xc;
  auVar115._8_4_ = auVar114._8_4_ + 0x800 >> 0xc;
  auVar115._12_4_ = auVar114._12_4_ + 0x800 >> 0xc;
  auVar79._0_4_ = auVar8._0_4_ + 0x800 >> 0xc;
  auVar79._4_4_ = auVar8._4_4_ + 0x800 >> 0xc;
  auVar79._8_4_ = auVar8._8_4_ + 0x800 >> 0xc;
  auVar79._12_4_ = auVar8._12_4_ + 0x800 >> 0xc;
  auVar116 = packssdw(auVar115,auVar79);
  auVar94._0_4_ = auVar83._0_4_ + 0x800 >> 0xc;
  auVar94._4_4_ = auVar83._4_4_ + 0x800 >> 0xc;
  auVar94._8_4_ = auVar83._8_4_ + 0x800 >> 0xc;
  auVar94._12_4_ = auVar83._12_4_ + 0x800 >> 0xc;
  auVar108._0_4_ = auVar98._0_4_ + 0x800 >> 0xc;
  auVar108._4_4_ = auVar98._4_4_ + 0x800 >> 0xc;
  auVar108._8_4_ = auVar98._8_4_ + 0x800 >> 0xc;
  auVar108._12_4_ = auVar98._12_4_ + 0x800 >> 0xc;
  auVar95 = packssdw(auVar94,auVar108);
  auVar40._0_12_ = alVar118._0_12_;
  auVar40._12_2_ = alVar118[0]._6_2_;
  auVar40._14_2_ = *(undefined2 *)((long)input[0xe] + 6);
  auVar39._12_4_ = auVar40._12_4_;
  auVar39._0_10_ = alVar118._0_10_;
  auVar39._10_2_ = *(undefined2 *)((long)input[0xe] + 4);
  auVar38._10_6_ = auVar39._10_6_;
  auVar38._0_8_ = alVar118[0];
  auVar38._8_2_ = alVar118[0]._4_2_;
  auVar37._8_8_ = auVar38._8_8_;
  auVar37._6_2_ = *(undefined2 *)((long)input[0xe] + 2);
  auVar37._4_2_ = alVar118[0]._2_2_;
  auVar37._0_2_ = (undefined2)alVar118[0];
  auVar37._2_2_ = (short)input[0xe][0];
  auVar60._2_2_ = (short)input[0xe][1];
  auVar60._0_2_ = (short)alVar118[1];
  auVar60._4_2_ = alVar118[1]._2_2_;
  auVar60._6_2_ = *(undefined2 *)((long)input[0xe] + 10);
  auVar60._8_2_ = alVar118[1]._4_2_;
  auVar60._10_2_ = *(undefined2 *)((long)input[0xe] + 0xc);
  auVar60._12_2_ = alVar118[1]._6_2_;
  auVar60._14_2_ = *(undefined2 *)((long)input[0xe] + 0xe);
  auVar76._8_4_ = 0xf04f031f;
  auVar76._0_8_ = 0xf04f031ff04f031f;
  auVar76._12_4_ = 0xf04f031f;
  auVar98 = pmaddwd(auVar37,auVar76);
  auVar8 = pmaddwd(auVar76,auVar60);
  auVar109._8_4_ = 0x31f0fb1;
  auVar109._0_8_ = 0x31f0fb1031f0fb1;
  auVar109._12_4_ = 0x31f0fb1;
  auVar83 = pmaddwd(auVar37,auVar109);
  auVar61 = pmaddwd(auVar60,auVar109);
  auVar48._0_4_ = auVar98._0_4_ + 0x800 >> 0xc;
  auVar48._4_4_ = auVar98._4_4_ + 0x800 >> 0xc;
  auVar48._8_4_ = auVar98._8_4_ + 0x800 >> 0xc;
  auVar48._12_4_ = auVar98._12_4_ + 0x800 >> 0xc;
  auVar81._0_4_ = auVar8._0_4_ + 0x800 >> 0xc;
  auVar81._4_4_ = auVar8._4_4_ + 0x800 >> 0xc;
  auVar81._8_4_ = auVar8._8_4_ + 0x800 >> 0xc;
  auVar81._12_4_ = auVar8._12_4_ + 0x800 >> 0xc;
  auVar114 = packssdw(auVar48,auVar81);
  auVar41._0_4_ = auVar83._0_4_ + 0x800 >> 0xc;
  auVar41._4_4_ = auVar83._4_4_ + 0x800 >> 0xc;
  auVar41._8_4_ = auVar83._8_4_ + 0x800 >> 0xc;
  auVar41._12_4_ = auVar83._12_4_ + 0x800 >> 0xc;
  auVar62._0_4_ = auVar61._0_4_ + 0x800 >> 0xc;
  auVar62._4_4_ = auVar61._4_4_ + 0x800 >> 0xc;
  auVar62._8_4_ = auVar61._8_4_ + 0x800 >> 0xc;
  auVar62._12_4_ = auVar61._12_4_ + 0x800 >> 0xc;
  auVar83 = packssdw(auVar41,auVar62);
  auVar66._0_12_ = alVar117._0_12_;
  auVar66._12_2_ = alVar117[0]._6_2_;
  auVar66._14_2_ = *(undefined2 *)((long)input[6] + 6);
  auVar65._12_4_ = auVar66._12_4_;
  auVar65._0_10_ = alVar117._0_10_;
  auVar65._10_2_ = *(undefined2 *)((long)input[6] + 4);
  auVar64._10_6_ = auVar65._10_6_;
  auVar64._0_8_ = alVar117[0];
  auVar64._8_2_ = alVar117[0]._4_2_;
  auVar63._8_8_ = auVar64._8_8_;
  auVar63._6_2_ = *(undefined2 *)((long)input[6] + 2);
  auVar63._4_2_ = alVar117[0]._2_2_;
  auVar63._0_2_ = (undefined2)alVar117[0];
  auVar63._2_2_ = (short)input[6][0];
  auVar44._2_2_ = (short)input[6][1];
  auVar44._0_2_ = (short)alVar117[1];
  auVar44._4_2_ = alVar117[1]._2_2_;
  auVar44._6_2_ = *(undefined2 *)((long)input[6] + 10);
  auVar44._8_2_ = alVar117[1]._4_2_;
  auVar44._10_2_ = *(undefined2 *)((long)input[6] + 0xc);
  auVar44._12_2_ = alVar117[1]._6_2_;
  auVar44._14_2_ = *(undefined2 *)((long)input[6] + 0xe);
  auVar87._8_4_ = 0xf71c0d4e;
  auVar87._0_8_ = 0xf71c0d4ef71c0d4e;
  auVar87._12_4_ = 0xf71c0d4e;
  auVar79 = pmaddwd(auVar63,auVar87);
  auVar8 = pmaddwd(auVar87,auVar44);
  auVar110._8_4_ = 0xd4e08e4;
  auVar110._0_8_ = 0xd4e08e40d4e08e4;
  auVar110._12_4_ = 0xd4e08e4;
  auVar61 = pmaddwd(auVar63,auVar110);
  auVar98 = pmaddwd(auVar44,auVar110);
  lVar7 = input[8][0];
  lVar4 = input[8][1];
  auVar80._0_4_ = auVar79._0_4_ + 0x800 >> 0xc;
  auVar80._4_4_ = auVar79._4_4_ + 0x800 >> 0xc;
  auVar80._8_4_ = auVar79._8_4_ + 0x800 >> 0xc;
  auVar80._12_4_ = auVar79._12_4_ + 0x800 >> 0xc;
  auVar96._0_4_ = auVar8._0_4_ + 0x800 >> 0xc;
  auVar96._4_4_ = auVar8._4_4_ + 0x800 >> 0xc;
  auVar96._8_4_ = auVar8._8_4_ + 0x800 >> 0xc;
  auVar96._12_4_ = auVar8._12_4_ + 0x800 >> 0xc;
  auVar81 = packssdw(auVar80,auVar96);
  alVar117 = input[4];
  auVar67._0_4_ = auVar61._0_4_ + 0x800 >> 0xc;
  auVar67._4_4_ = auVar61._4_4_ + 0x800 >> 0xc;
  auVar67._8_4_ = auVar61._8_4_ + 0x800 >> 0xc;
  auVar67._12_4_ = auVar61._12_4_ + 0x800 >> 0xc;
  auVar45._0_4_ = auVar98._0_4_ + 0x800 >> 0xc;
  auVar45._4_4_ = auVar98._4_4_ + 0x800 >> 0xc;
  auVar45._8_4_ = auVar98._8_4_ + 0x800 >> 0xc;
  auVar45._12_4_ = auVar98._12_4_ + 0x800 >> 0xc;
  auVar79 = packssdw(auVar67,auVar45);
  local_b8 = paddsw(auVar12,auVar86);
  lVar5 = input[0xc][0];
  lVar6 = input[0xc][1];
  alVar118 = *input;
  auVar12 = psubsw(auVar12,auVar86);
  auVar98 = psubsw(auVar116,auVar54);
  local_88 = paddsw(auVar116,auVar54);
  local_78 = paddsw(auVar95,auVar105);
  auVar96 = psubsw(auVar95,auVar105);
  auVar87 = psubsw(auVar56,auVar74);
  local_48 = paddsw(auVar74,auVar56);
  local_168 = (undefined2)lVar7;
  uStack_166 = (undefined2)((ulong)lVar7 >> 0x10);
  uStack_164 = (undefined2)((ulong)lVar7 >> 0x20);
  uStack_162 = (undefined2)((ulong)lVar7 >> 0x30);
  uStack_160 = (undefined2)lVar4;
  uStack_15e = (undefined2)((ulong)lVar4 >> 0x10);
  uStack_15c = (undefined2)((ulong)lVar4 >> 0x20);
  uStack_15a = (undefined2)((ulong)lVar4 >> 0x30);
  auVar25._0_12_ = alVar118._0_12_;
  auVar25._12_2_ = alVar118[0]._6_2_;
  auVar25._14_2_ = uStack_162;
  auVar24._12_4_ = auVar25._12_4_;
  auVar24._0_10_ = alVar118._0_10_;
  auVar24._10_2_ = uStack_164;
  auVar23._10_6_ = auVar24._10_6_;
  auVar23._0_8_ = alVar118[0];
  auVar23._8_2_ = alVar118[0]._4_2_;
  auVar22._8_8_ = auVar23._8_8_;
  auVar22._6_2_ = uStack_166;
  auVar22._4_2_ = alVar118[0]._2_2_;
  auVar22._0_2_ = (undefined2)alVar118[0];
  auVar22._2_2_ = local_168;
  auVar56._2_2_ = uStack_160;
  auVar56._0_2_ = (short)alVar118[1];
  auVar56._4_2_ = alVar118[1]._2_2_;
  auVar56._6_2_ = uStack_15e;
  auVar56._8_2_ = alVar118[1]._4_2_;
  auVar56._10_2_ = uStack_15c;
  auVar56._12_2_ = alVar118[1]._6_2_;
  auVar56._14_2_ = uStack_15a;
  auVar75._8_4_ = 0xb500b50;
  auVar75._0_8_ = 0xb500b500b500b50;
  auVar75._12_4_ = 0xb500b50;
  auVar61 = pmaddwd(auVar22,auVar75);
  auVar76 = pmaddwd(auVar75,auVar56);
  auVar106._8_4_ = 0xf4b00b50;
  auVar106._0_8_ = 0xf4b00b50f4b00b50;
  auVar106._12_4_ = 0xf4b00b50;
  auVar54 = pmaddwd(auVar22,auVar106);
  auVar8 = pmaddwd(auVar56,auVar106);
  auVar57._0_4_ = auVar61._0_4_ + 0x800 >> 0xc;
  auVar57._4_4_ = auVar61._4_4_ + 0x800 >> 0xc;
  auVar57._8_4_ = auVar61._8_4_ + 0x800 >> 0xc;
  auVar57._12_4_ = auVar61._12_4_ + 0x800 >> 0xc;
  auVar77._0_4_ = auVar76._0_4_ + 0x800 >> 0xc;
  auVar77._4_4_ = auVar76._4_4_ + 0x800 >> 0xc;
  auVar77._8_4_ = auVar76._8_4_ + 0x800 >> 0xc;
  auVar77._12_4_ = auVar76._12_4_ + 0x800 >> 0xc;
  local_138 = (__m128i)packssdw(auVar57,auVar77);
  cospi = (int32_t *)0xec8061f;
  auVar26._0_4_ = auVar54._0_4_ + 0x800 >> 0xc;
  auVar26._4_4_ = auVar54._4_4_ + 0x800 >> 0xc;
  auVar26._8_4_ = auVar54._8_4_ + 0x800 >> 0xc;
  auVar26._12_4_ = auVar54._12_4_ + 0x800 >> 0xc;
  auVar74._0_4_ = auVar8._0_4_ + 0x800 >> 0xc;
  auVar74._4_4_ = auVar8._4_4_ + 0x800 >> 0xc;
  auVar74._8_4_ = auVar8._8_4_ + 0x800 >> 0xc;
  auVar74._12_4_ = auVar8._12_4_ + 0x800 >> 0xc;
  local_128 = packssdw(auVar26,auVar74);
  cos_bit = -0x38;
  local_158 = (undefined2)lVar5;
  uStack_156 = (undefined2)((ulong)lVar5 >> 0x10);
  uStack_154 = (undefined2)((ulong)lVar5 >> 0x20);
  uStack_152 = (undefined2)((ulong)lVar5 >> 0x30);
  uStack_150 = (undefined2)lVar6;
  uStack_14e = (undefined2)((ulong)lVar6 >> 0x10);
  uStack_14c = (undefined2)((ulong)lVar6 >> 0x20);
  uStack_14a = (undefined2)((ulong)lVar6 >> 0x30);
  auVar116._0_12_ = alVar117._0_12_;
  auVar116._12_2_ = alVar117[0]._6_2_;
  auVar116._14_2_ = uStack_152;
  auVar105._12_4_ = auVar116._12_4_;
  auVar105._0_10_ = alVar117._0_10_;
  auVar105._10_2_ = uStack_154;
  auVar95._10_6_ = auVar105._10_6_;
  auVar95._0_8_ = alVar117[0];
  auVar95._8_2_ = alVar117[0]._4_2_;
  auVar86._8_8_ = auVar95._8_8_;
  auVar86._6_2_ = uStack_156;
  auVar86._4_2_ = alVar117[0]._2_2_;
  auVar86._0_2_ = (undefined2)alVar117[0];
  auVar86._2_2_ = local_158;
  auVar111._2_2_ = uStack_150;
  auVar111._0_2_ = (short)alVar117[1];
  auVar111._4_2_ = alVar117[1]._2_2_;
  auVar111._6_2_ = uStack_14e;
  auVar111._8_2_ = alVar117[1]._4_2_;
  auVar111._10_2_ = uStack_14c;
  auVar111._12_2_ = alVar117[1]._6_2_;
  auVar111._14_2_ = uStack_14a;
  auVar27._8_4_ = 0xf138061f;
  auVar27._0_8_ = 0xf138061ff138061f;
  auVar27._12_4_ = 0xf138061f;
  auVar61 = pmaddwd(auVar86,auVar27);
  auVar54 = pmaddwd(auVar27,auVar111);
  auVar58._8_4_ = 0x61f0ec8;
  auVar58._0_8_ = 0x61f0ec8061f0ec8;
  auVar58._12_4_ = 0x61f0ec8;
  auVar8 = pmaddwd(auVar86,auVar58);
  auVar76 = pmaddwd(auVar111,auVar58);
  auVar78._0_4_ = auVar61._0_4_ + 0x800 >> 0xc;
  auVar78._4_4_ = auVar61._4_4_ + 0x800 >> 0xc;
  auVar78._8_4_ = auVar61._8_4_ + 0x800 >> 0xc;
  auVar78._12_4_ = auVar61._12_4_ + 0x800 >> 0xc;
  auVar28._0_4_ = auVar54._0_4_ + 0x800 >> 0xc;
  auVar28._4_4_ = auVar54._4_4_ + 0x800 >> 0xc;
  auVar28._8_4_ = auVar54._8_4_ + 0x800 >> 0xc;
  auVar28._12_4_ = auVar54._12_4_ + 0x800 >> 0xc;
  local_118 = packssdw(auVar78,auVar28);
  auVar9._0_4_ = auVar8._0_4_ + 0x800 >> 0xc;
  auVar9._4_4_ = auVar8._4_4_ + 0x800 >> 0xc;
  auVar9._8_4_ = auVar8._8_4_ + 0x800 >> 0xc;
  auVar9._12_4_ = auVar8._12_4_ + 0x800 >> 0xc;
  auVar112._0_4_ = auVar76._0_4_ + 0x800 >> 0xc;
  auVar112._4_4_ = auVar76._4_4_ + 0x800 >> 0xc;
  auVar112._8_4_ = auVar76._8_4_ + 0x800 >> 0xc;
  auVar112._12_4_ = auVar76._12_4_ + 0x800 >> 0xc;
  local_108 = packssdw(auVar9,auVar112);
  local_f8 = paddsw(auVar114,auVar81);
  local_e8 = psubsw(auVar114,auVar81);
  local_d8 = psubsw(auVar83,auVar79);
  local_c8 = paddsw(auVar79,auVar83);
  auVar32._0_12_ = auVar12._0_12_;
  auVar32._12_2_ = auVar12._6_2_;
  auVar32._14_2_ = auVar87._6_2_;
  auVar31._12_4_ = auVar32._12_4_;
  auVar31._0_10_ = auVar12._0_10_;
  auVar31._10_2_ = auVar87._4_2_;
  auVar30._10_6_ = auVar31._10_6_;
  auVar30._0_8_ = auVar12._0_8_;
  auVar30._8_2_ = auVar12._4_2_;
  auVar29._8_8_ = auVar30._8_8_;
  auVar29._6_2_ = auVar87._2_2_;
  auVar29._4_2_ = auVar12._2_2_;
  auVar29._0_2_ = auVar12._0_2_;
  auVar29._2_2_ = auVar87._0_2_;
  auVar14._2_2_ = auVar87._8_2_;
  auVar14._0_2_ = auVar12._8_2_;
  auVar14._4_2_ = auVar12._10_2_;
  auVar14._6_2_ = auVar87._10_2_;
  auVar14._8_2_ = auVar12._12_2_;
  auVar14._10_2_ = auVar87._12_2_;
  auVar14._12_2_ = auVar12._14_2_;
  auVar14._14_2_ = auVar87._14_2_;
  auVar10._8_4_ = 0xec8061f;
  auVar10._0_8_ = 0xec8061f0ec8061f;
  auVar10._12_4_ = 0xec8061f;
  auVar12 = pmaddwd(auVar29,auVar10);
  auVar8 = pmaddwd(auVar14,auVar10);
  auVar11._8_4_ = 0x61ff138;
  auVar11._0_8_ = 0x61ff138061ff138;
  auVar11._12_4_ = 0x61ff138;
  auVar54 = pmaddwd(auVar29,auVar11);
  auVar83 = pmaddwd(auVar14,auVar11);
  auVar42._0_4_ = auVar54._0_4_ + 0x800 >> 0xc;
  auVar42._4_4_ = auVar54._4_4_ + 0x800 >> 0xc;
  auVar42._8_4_ = auVar54._8_4_ + 0x800 >> 0xc;
  auVar42._12_4_ = auVar54._12_4_ + 0x800 >> 0xc;
  auVar49._0_4_ = auVar83._0_4_ + 0x800 >> 0xc;
  auVar49._4_4_ = auVar83._4_4_ + 0x800 >> 0xc;
  auVar49._8_4_ = auVar83._8_4_ + 0x800 >> 0xc;
  auVar49._12_4_ = auVar83._12_4_ + 0x800 >> 0xc;
  local_a8 = packssdw(auVar42,auVar49);
  auVar33._0_4_ = auVar12._0_4_ + 0x800 >> 0xc;
  auVar33._4_4_ = auVar12._4_4_ + 0x800 >> 0xc;
  auVar33._8_4_ = auVar12._8_4_ + 0x800 >> 0xc;
  auVar33._12_4_ = auVar12._12_4_ + 0x800 >> 0xc;
  auVar15._0_4_ = auVar8._0_4_ + 0x800 >> 0xc;
  auVar15._4_4_ = auVar8._4_4_ + 0x800 >> 0xc;
  auVar15._8_4_ = auVar8._8_4_ + 0x800 >> 0xc;
  auVar15._12_4_ = auVar8._12_4_ + 0x800 >> 0xc;
  local_58 = packssdw(auVar33,auVar15);
  auVar19._0_12_ = auVar98._0_12_;
  auVar19._12_2_ = auVar98._6_2_;
  auVar19._14_2_ = auVar96._6_2_;
  auVar18._12_4_ = auVar19._12_4_;
  auVar18._0_10_ = auVar98._0_10_;
  auVar18._10_2_ = auVar96._4_2_;
  auVar17._10_6_ = auVar18._10_6_;
  auVar17._0_8_ = auVar98._0_8_;
  auVar17._8_2_ = auVar98._4_2_;
  auVar16._8_8_ = auVar17._8_8_;
  auVar16._6_2_ = auVar96._2_2_;
  auVar16._4_2_ = auVar98._2_2_;
  auVar16._0_2_ = auVar98._0_2_;
  auVar16._2_2_ = auVar96._0_2_;
  auVar46._2_2_ = auVar96._8_2_;
  auVar46._0_2_ = auVar98._8_2_;
  auVar46._4_2_ = auVar98._10_2_;
  auVar46._6_2_ = auVar96._10_2_;
  auVar46._8_2_ = auVar98._12_2_;
  auVar46._10_2_ = auVar96._12_2_;
  auVar46._12_2_ = auVar98._14_2_;
  auVar46._14_2_ = auVar96._14_2_;
  auVar34._8_4_ = 0xf138f9e1;
  auVar34._0_8_ = 0xf138f9e1f138f9e1;
  auVar34._12_4_ = 0xf138f9e1;
  auVar54 = pmaddwd(auVar16,auVar34);
  auVar12 = pmaddwd(auVar34,auVar46);
  auVar8 = pmaddwd(auVar16,auVar11);
  auVar83 = pmaddwd(auVar46,auVar11);
  auVar43._0_4_ = auVar54._0_4_ + 0x800 >> 0xc;
  auVar43._4_4_ = auVar54._4_4_ + 0x800 >> 0xc;
  auVar43._8_4_ = auVar54._8_4_ + 0x800 >> 0xc;
  auVar43._12_4_ = auVar54._12_4_ + 0x800 >> 0xc;
  auVar35._0_4_ = auVar12._0_4_ + 0x800 >> 0xc;
  auVar35._4_4_ = auVar12._4_4_ + 0x800 >> 0xc;
  auVar35._8_4_ = auVar12._8_4_ + 0x800 >> 0xc;
  auVar35._12_4_ = auVar12._12_4_ + 0x800 >> 0xc;
  local_98 = packssdw(auVar43,auVar35);
  auVar20._0_4_ = auVar8._0_4_ + 0x800 >> 0xc;
  auVar20._4_4_ = auVar8._4_4_ + 0x800 >> 0xc;
  auVar20._8_4_ = auVar8._8_4_ + 0x800 >> 0xc;
  auVar20._12_4_ = auVar8._12_4_ + 0x800 >> 0xc;
  auVar47._0_4_ = auVar83._0_4_ + 0x800 >> 0xc;
  auVar47._4_4_ = auVar83._4_4_ + 0x800 >> 0xc;
  auVar47._8_4_ = auVar83._8_4_ + 0x800 >> 0xc;
  auVar47._12_4_ = auVar83._12_4_ + 0x800 >> 0xc;
  local_68 = packssdw(auVar20,auVar47);
  alVar117[1]._0_4_ = 0x61ff138;
  alVar117[0] = 0xf138f9e1;
  alVar117[1]._4_4_ = 0;
  lVar7 = 0x61ff138;
  idct16_stage5_sse2(&local_138,(int32_t *)0xec8061f,alVar117,-0x38);
  alVar118[1] = lVar7;
  alVar118[0] = extraout_RDX;
  idct16_stage6_sse2(&local_138,cospi,alVar118,cos_bit);
  idct16_stage7_sse2(output,&local_138);
  return;
}

Assistant:

static void idct16_sse2(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p60_m04 = pair_set_epi16(cospi[60], -cospi[4]);
  const __m128i cospi_p04_p60 = pair_set_epi16(cospi[4], cospi[60]);
  const __m128i cospi_p28_m36 = pair_set_epi16(cospi[28], -cospi[36]);
  const __m128i cospi_p36_p28 = pair_set_epi16(cospi[36], cospi[28]);
  const __m128i cospi_p44_m20 = pair_set_epi16(cospi[44], -cospi[20]);
  const __m128i cospi_p20_p44 = pair_set_epi16(cospi[20], cospi[44]);
  const __m128i cospi_p12_m52 = pair_set_epi16(cospi[12], -cospi[52]);
  const __m128i cospi_p52_p12 = pair_set_epi16(cospi[52], cospi[12]);
  const __m128i cospi_p56_m08 = pair_set_epi16(cospi[56], -cospi[8]);
  const __m128i cospi_p08_p56 = pair_set_epi16(cospi[8], cospi[56]);
  const __m128i cospi_p24_m40 = pair_set_epi16(cospi[24], -cospi[40]);
  const __m128i cospi_p40_p24 = pair_set_epi16(cospi[40], cospi[24]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  const __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  const __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);
  const __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  const __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  const __m128i cospi_m48_m16 = pair_set_epi16(-cospi[48], -cospi[16]);

  // stage 1
  __m128i x[16];
  x[0] = input[0];
  x[1] = input[8];
  x[2] = input[4];
  x[3] = input[12];
  x[4] = input[2];
  x[5] = input[10];
  x[6] = input[6];
  x[7] = input[14];
  x[8] = input[1];
  x[9] = input[9];
  x[10] = input[5];
  x[11] = input[13];
  x[12] = input[3];
  x[13] = input[11];
  x[14] = input[7];
  x[15] = input[15];

  // stage 2
  btf_16_sse2(cospi_p60_m04, cospi_p04_p60, x[8], x[15], x[8], x[15]);
  btf_16_sse2(cospi_p28_m36, cospi_p36_p28, x[9], x[14], x[9], x[14]);
  btf_16_sse2(cospi_p44_m20, cospi_p20_p44, x[10], x[13], x[10], x[13]);
  btf_16_sse2(cospi_p12_m52, cospi_p52_p12, x[11], x[12], x[11], x[12]);

  // stage 3
  btf_16_sse2(cospi_p56_m08, cospi_p08_p56, x[4], x[7], x[4], x[7]);
  btf_16_sse2(cospi_p24_m40, cospi_p40_p24, x[5], x[6], x[5], x[6]);
  btf_16_adds_subs_sse2(x[8], x[9]);
  btf_16_subs_adds_sse2(x[11], x[10]);
  btf_16_adds_subs_sse2(x[12], x[13]);
  btf_16_subs_adds_sse2(x[15], x[14]);

  // stage 4
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x[0], x[1], x[0], x[1]);
  btf_16_sse2(cospi_p48_m16, cospi_p16_p48, x[2], x[3], x[2], x[3]);
  btf_16_adds_subs_sse2(x[4], x[5]);
  btf_16_subs_adds_sse2(x[7], x[6]);
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x[9], x[14], x[9], x[14]);
  btf_16_sse2(cospi_m48_m16, cospi_m16_p48, x[10], x[13], x[10], x[13]);

  // stage 5~7
  idct16_stage5_sse2(x, cospi, __rounding, cos_bit);
  idct16_stage6_sse2(x, cospi, __rounding, cos_bit);
  idct16_stage7_sse2(output, x);
}